

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWin.c
# Opt level: O1

int Wlc_ObjHasArithmFanins(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  int iVar1;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar2;
  ulong uVar3;
  long lVar4;
  
  iVar1 = Wlc_ObjHasArithm_rec(p,pObj);
  if (iVar1 != 0) {
    __assert_fail("!Wlc_ObjHasArithm_rec(p, pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcWin.c"
                  ,0x51,"int Wlc_ObjHasArithmFanins(Wlc_Ntk_t *, Wlc_Obj_t *)");
  }
  uVar3 = (ulong)pObj->nFanins;
  if (0 < (int)pObj->nFanins) {
    lVar4 = 0;
    do {
      if ((2 < (uint)uVar3) ||
         (paVar2 = &pObj->field_10,
         (undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x2f) ==
         (undefined1  [24])0x6)) {
        paVar2 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj->field_10).pFanins[0];
      }
      iVar1 = paVar2->Fanins[lVar4];
      if (((long)iVar1 < 1) || (p->nObjsAlloc <= iVar1)) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      iVar1 = Wlc_ObjHasArithm_rec(p,p->pObjs + iVar1);
      if (iVar1 != 0) {
        return 1;
      }
      lVar4 = lVar4 + 1;
      uVar3 = (ulong)(int)pObj->nFanins;
    } while (lVar4 < (long)uVar3);
  }
  return 0;
}

Assistant:

int Wlc_ObjHasArithmFanins( Wlc_Ntk_t * p, Wlc_Obj_t * pObj )
{
    Wlc_Obj_t * pFanin;  int i;
    assert( !Wlc_ObjHasArithm_rec(p, pObj) );
    Wlc_ObjForEachFaninObj( p, pObj, pFanin, i )
        if ( Wlc_ObjHasArithm_rec(p, pFanin) )
            return 1;
    return 0;
}